

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

Message * __thiscall
FIX::Session::newMessage(Message *__return_storage_ptr__,Session *this,MsgType *msgType)

{
  bool bVar1;
  BeginString *beginString;
  FieldMap *pFVar2;
  DataDictionary *pDVar3;
  string *psVar4;
  message_order *order;
  bool local_159;
  message_order *messageOrder_1;
  DataDictionary *local_c8;
  DataDictionary *applicationDD;
  message_order *local_b8;
  message_order *messageOrder;
  MsgType local_a8;
  message_order *local_50;
  message_order *trailerOrder;
  message_order *headerOrder;
  undefined1 local_29;
  DataDictionary *local_28;
  DataDictionary *sessionDD;
  MsgType *msgType_local;
  Session *this_local;
  Message *message;
  
  sessionDD = (DataDictionary *)msgType;
  msgType_local = (MsgType *)this;
  this_local = (Session *)__return_storage_ptr__;
  beginString = SessionID::getBeginString(&this->m_sessionID);
  local_28 = DataDictionaryProvider::getSessionDataDictionary
                       (&this->m_dataDictionaryProvider,beginString);
  bVar1 = DataDictionary::isMessageFieldsOrderPreserved(local_28);
  if (bVar1) {
    trailerOrder = DataDictionary::getHeaderOrderedFields(local_28);
    local_50 = DataDictionary::getTrailerOrderedFields(local_28);
    bVar1 = SessionID::isFIXT(&this->m_sessionID);
    messageOrder._7_1_ = 0;
    local_159 = true;
    if (bVar1) {
      psVar4 = StringField::getValue_abi_cxx11_((StringField *)sessionDD);
      MsgType::MsgType(&local_a8,psVar4);
      messageOrder._7_1_ = 1;
      local_159 = Message::isAdminMsgType(&local_a8);
    }
    if ((messageOrder._7_1_ & 1) != 0) {
      MsgType::~MsgType(&local_a8);
    }
    pDVar3 = local_28;
    if (local_159 == false) {
      ApplVerID::ApplVerID((ApplVerID *)&messageOrder_1,&this->m_senderDefaultApplVerID);
      pDVar3 = DataDictionaryProvider::getApplicationDataDictionary
                         (&this->m_dataDictionaryProvider,(ApplVerID *)&messageOrder_1);
      ApplVerID::~ApplVerID((ApplVerID *)&messageOrder_1);
      local_c8 = pDVar3;
      psVar4 = StringField::getValue_abi_cxx11_((StringField *)sessionDD);
      order = DataDictionary::getMessageOrderedFields(pDVar3,psVar4);
      Message::Message(__return_storage_ptr__,trailerOrder,local_50,order);
      pFVar2 = &Message::getHeader(__return_storage_ptr__)->super_FieldMap;
      FieldMap::setField(pFVar2,(FieldBase *)sessionDD,true);
    }
    else {
      psVar4 = StringField::getValue_abi_cxx11_((StringField *)sessionDD);
      local_b8 = DataDictionary::getMessageOrderedFields(pDVar3,psVar4);
      applicationDD._7_1_ = 0;
      Message::Message(__return_storage_ptr__,trailerOrder,local_50,local_b8);
      pFVar2 = &Message::getHeader(__return_storage_ptr__)->super_FieldMap;
      FieldMap::setField(pFVar2,(FieldBase *)sessionDD,true);
    }
  }
  else {
    local_29 = 0;
    Message::Message(__return_storage_ptr__);
    pFVar2 = &Message::getHeader(__return_storage_ptr__)->super_FieldMap;
    FieldMap::setField(pFVar2,(FieldBase *)sessionDD,true);
  }
  return __return_storage_ptr__;
}

Assistant:

Message Session::newMessage(const MsgType &msgType) const {
  const DataDictionary &sessionDD = m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());

  if (!sessionDD.isMessageFieldsOrderPreserved()) {
    Message message = Message();
    message.getHeader().setField(msgType);
    return message;
  } else {
    const message_order &headerOrder = sessionDD.getHeaderOrderedFields();
    const message_order &trailerOrder = sessionDD.getTrailerOrderedFields();
    if (!m_sessionID.isFIXT() || Message::isAdminMsgType(msgType.getValue())) {
      const message_order &messageOrder = sessionDD.getMessageOrderedFields(msgType.getValue());
      Message message = Message(headerOrder, trailerOrder, messageOrder);
      message.getHeader().setField(msgType);
      return message;
    } else {
      const DataDictionary &applicationDD
          = m_dataDictionaryProvider.getApplicationDataDictionary(m_senderDefaultApplVerID);
      const message_order &messageOrder = applicationDD.getMessageOrderedFields(msgType.getValue());
      Message message = Message(headerOrder, trailerOrder, messageOrder);
      message.getHeader().setField(msgType);
      return message;
    }
  }
}